

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O2

char * mp::SkipToMatchingQuote(char *s)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  
  pcVar2 = s + 1;
  do {
    pcVar3 = pcVar2 + 1;
    cVar1 = *pcVar2;
    pcVar2 = pcVar3;
  } while (cVar1 != *s);
  return pcVar3;
}

Assistant:

const char* SkipToMatchingQuote(const char* s) {
  assert((*s == '\'') || (*s == '"'));
  char quote = s[0];
  ++s;
  while (*s != quote)
    ++s;
  return ++s;
}